

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parson.c
# Opt level: O1

JSON_Status json_array_add(JSON_Array *array,JSON_Value *value)

{
  ulong uVar1;
  JSON_Status JVar2;
  JSON_Value *pJVar3;
  size_t sVar4;
  
  if (array->capacity <= array->count) {
    uVar1 = array->capacity * 2;
    sVar4 = 0x10;
    if (0x10 < uVar1) {
      sVar4 = uVar1;
    }
    JVar2 = json_array_resize(array,sVar4);
    if (JVar2 != 0) {
      return -1;
    }
  }
  if (array == (JSON_Array *)0x0) {
    pJVar3 = (JSON_Value *)0x0;
  }
  else {
    pJVar3 = array->wrapping_value;
  }
  value->parent = pJVar3;
  sVar4 = array->count;
  array->items[sVar4] = value;
  array->count = sVar4 + 1;
  return 0;
}

Assistant:

static JSON_Status json_array_add(JSON_Array *array, JSON_Value *value) {
    if (array->count >= array->capacity) {
        size_t new_capacity = MAX(array->capacity * 2, STARTING_CAPACITY);
        if (json_array_resize(array, new_capacity) != JSONSuccess) {
            return JSONFailure;
        }
    }
    value->parent = json_array_get_wrapping_value(array);
    array->items[array->count] = value;
    array->count++;
    return JSONSuccess;
}